

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Metadpy_update(wchar_t flush,wchar_t sync,wchar_t discard)

{
  wchar_t discard_local;
  wchar_t sync_local;
  wchar_t flush_local;
  
  if (flush != L'\0') {
    XFlush(Metadpy->dpy);
  }
  if (sync != L'\0') {
    XSync(Metadpy->dpy,discard);
  }
  return 0;
}

Assistant:

static errr Metadpy_update(int flush, int sync, int discard)
{
	/* Flush if desired */
	if (flush) XFlush(Metadpy->dpy);

	/* Sync if desired, using 'discard' */
	if (sync) XSync(Metadpy->dpy, discard);

	/* Success */
	return (0);
}